

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::findCommonInLeaf<1>(InnerLeaf<1> *leaf,NodePtr n2,int hashPos)

{
  byte bVar1;
  Type TVar2;
  uint uVar3;
  BranchNode *this;
  uint64_t uVar4;
  uint64_t uVar5;
  int *key;
  reference pvVar6;
  reference pvVar7;
  ValueType *pVVar8;
  InnerLeaf<4> *leaf2;
  undefined4 in_EDX;
  NodePtr in_RDI;
  int j;
  int i;
  int pos;
  int offset;
  uint64_t matchMask;
  BranchNode *branch;
  undefined7 in_stack_ffffffffffffff68;
  uint8_t in_stack_ffffffffffffff6f;
  uint7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined8 in_stack_ffffffffffffffa8;
  int hashPos_00;
  InnerLeaf<1> *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  NodePtr local_10;
  HighsHashTableEntry<int,_int> *local_8;
  
  hashPos_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  TVar2 = NodePtr::getType(&local_10);
  leaf2 = (InnerLeaf<4> *)(ulong)(TVar2 - kInnerLeafSizeClass1);
  switch(leaf2) {
  case (InnerLeaf<4> *)0x0:
    NodePtr::getInnerLeafSizeClass1(&local_10);
    local_8 = HighsHashTree<int,int>::findCommonInLeaf<1,1>
                        (in_stack_ffffffffffffffb8,(InnerLeaf<1> *)leaf2,
                         (int)(in_RDI.ptrAndType >> 0x20));
    break;
  case (InnerLeaf<4> *)0x1:
    NodePtr::getInnerLeafSizeClass2(&local_10);
    local_8 = HighsHashTree<int,int>::findCommonInLeaf<1,2>
                        (in_stack_ffffffffffffffb8,(InnerLeaf<2> *)leaf2,hashPos_00);
    break;
  case (InnerLeaf<4> *)0x2:
    NodePtr::getInnerLeafSizeClass3(&local_10);
    local_8 = HighsHashTree<int,int>::findCommonInLeaf<1,3>
                        (in_stack_ffffffffffffffb8,(InnerLeaf<3> *)leaf2,hashPos_00);
    break;
  case (InnerLeaf<4> *)0x3:
    NodePtr::getInnerLeafSizeClass4(&local_10);
    local_8 = HighsHashTree<int,int>::findCommonInLeaf<1,4>
                        (in_stack_ffffffffffffffb8,leaf2,hashPos_00);
    break;
  case (InnerLeaf<4> *)0x4:
    this = NodePtr::getBranchNode(&local_10);
    uVar4 = ::HighsHashTree::Occupation::operator_cast_to_unsigned_long((Occupation *)this);
    uVar5 = ::HighsHashTree::Occupation::operator_cast_to_unsigned_long
                      ((Occupation *)in_RDI.ptrAndType);
    key = (int *)(uVar4 & uVar5);
    local_34 = -1;
    while (key != (int *)0x0) {
      uVar3 = HighsHashHelpers::log2i((uint64_t)key);
      key = (int *)(1L << ((byte)uVar3 & 0x3f) ^ (ulong)key);
      local_3c = Occupation::num_set_until
                           ((Occupation *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6f);
      local_3c = local_3c + local_34;
      while( true ) {
        pvVar6 = std::array<unsigned_long,_7UL>::operator[]
                           ((array<unsigned_long,_7UL> *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        bVar1 = get_first_chunk16((uint16_t)*pvVar6);
        if (bVar1 == uVar3) break;
        local_3c = local_3c + 1;
        local_34 = local_34 + 1;
      }
      Occupation::num_set_until
                ((Occupation *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6f);
      do {
        pvVar7 = std::array<HighsHashTableEntry<int,_int>,_6UL>::operator[]
                           ((array<HighsHashTableEntry<int,_int>,_6UL> *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        HighsHashTableEntry<int,_int>::key(pvVar7);
        compute_hash((int *)0x575a38);
        pvVar7 = std::array<HighsHashTableEntry<int,_int>,_6UL>::operator[]
                           ((array<HighsHashTableEntry<int,_int>,_6UL> *)
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                            CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        HighsHashTableEntry<int,_int>::key(pvVar7);
        pVVar8 = find_recurse(in_RDI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                              (int)((ulong)this >> 0x20),key);
        if (pVVar8 != (ValueType *)0x0) {
          pvVar7 = std::array<HighsHashTableEntry<int,_int>,_6UL>::operator[]
                             ((array<HighsHashTableEntry<int,_int>,_6UL> *)
                              CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          return pvVar7;
        }
        local_3c = local_3c + 1;
        in_stack_ffffffffffffff77 = false;
        if (local_3c < *(int *)(in_RDI.ptrAndType + 8)) {
          pvVar6 = std::array<unsigned_long,_7UL>::operator[]
                             ((array<unsigned_long,_7UL> *)(ulong)in_stack_ffffffffffffff70,
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          bVar1 = get_first_chunk16((uint16_t)*pvVar6);
          in_stack_ffffffffffffff77 = bVar1 == uVar3;
        }
      } while ((bool)in_stack_ffffffffffffff77 != false);
    }
  default:
    local_8 = (HighsHashTableEntry<int,_int> *)0x0;
  }
  return local_8;
}

Assistant:

static HighsHashTableEntry<K, V>* findCommonInLeaf(InnerLeaf<SizeClass>* leaf,
                                                     NodePtr n2, int hashPos) {
    switch (n2.getType()) {
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass1(), hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass2(), hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass3(), hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass4(), hashPos);
      case kBranchNode: {
        BranchNode* branch = n2.getBranchNode();
        uint64_t matchMask = branch->occupation & leaf->occupation;

        int offset = -1;
        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          matchMask ^= (uint64_t{1} << pos);

          int i = leaf->occupation.num_set_until(static_cast<uint8_t>(pos)) +
                  offset;
          while (get_first_chunk16(leaf->hashes[i]) != pos) {
            ++i;
            ++offset;
          }

          int j =
              branch->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          do {
            if (find_recurse(branch->child[j],
                             compute_hash(leaf->entries[i].key()), hashPos + 1,
                             leaf->entries[i].key()))
              return &leaf->entries[i];
            ++i;
          } while (i < leaf->size && get_first_chunk16(leaf->hashes[i]) == pos);
        }
        break;
      }
      default:
        break;
    }

    return nullptr;
  }